

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::commitParameters(Private_Impl *this)

{
  Private_Impl *in_RDI;
  Private_Impl *unaff_retaddr;
  
  commitSaturation(in_RDI);
  commitSharpness(in_RDI);
  commitContrast(in_RDI);
  commitBrightness(in_RDI);
  commitISO((Private_Impl *)0x10bc60);
  if ((in_RDI->State).shutterSpeed == 0) {
    commitExposure(unaff_retaddr);
  }
  else {
    commitShutterSpeed((Private_Impl *)0x10bc75);
    (in_RDI->State).rpc_exposureMode = RASPICAM_EXPOSURE_FIXEDFPS;
    commitExposure(unaff_retaddr);
  }
  commitExposureCompensation((Private_Impl *)0x10bc9c);
  commitMetering(unaff_retaddr);
  commitImageEffect(unaff_retaddr);
  commitRotation(in_RDI);
  commitFlips(unaff_retaddr);
  commitVideoStabilization((Private_Impl *)0x10bcce);
  commitAWB(unaff_retaddr);
  commitAWB_RB(unaff_retaddr);
  return;
}

Assistant:

void Private_Impl::commitParameters ( ) {
            assert ( State.camera_component!=0 );
            commitSaturation();
            commitSharpness();
            commitContrast();
            commitBrightness();
            commitISO();
            if ( State.shutterSpeed!=0 ) {
                commitShutterSpeed();
                State.rpc_exposureMode=RASPICAM_EXPOSURE_FIXEDFPS;
                commitExposure();
            } else           commitExposure();
            commitExposureCompensation();
            commitMetering();
            commitImageEffect();
            commitRotation();
            commitFlips();
            commitVideoStabilization();
            commitAWB();
            commitAWB_RB();

        }